

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void Mem_StepStop(Mem_Step_t *p,int fVerbose)

{
  int local_18;
  int i;
  int fVerbose_local;
  Mem_Step_t *p_local;
  
  for (local_18 = 0; local_18 < p->nMems; local_18 = local_18 + 1) {
    Mem_FixedStop(p->pMems[local_18],fVerbose);
  }
  if (p->pLargeChunks != (void **)0x0) {
    for (local_18 = 0; local_18 < p->nLargeChunks; local_18 = local_18 + 1) {
      if (p->pLargeChunks[local_18] != (void *)0x0) {
        free(p->pLargeChunks[local_18]);
        p->pLargeChunks[local_18] = (void *)0x0;
      }
    }
    if (p->pLargeChunks != (void **)0x0) {
      free(p->pLargeChunks);
      p->pLargeChunks = (void **)0x0;
    }
  }
  if (p->pMems != (Mem_Fixed_t **)0x0) {
    free(p->pMems);
    p->pMems = (Mem_Fixed_t **)0x0;
  }
  if (p->pMap != (Mem_Fixed_t **)0x0) {
    free(p->pMap);
    p->pMap = (Mem_Fixed_t **)0x0;
  }
  if (p != (Mem_Step_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Mem_StepStop( Mem_Step_t * p, int fVerbose )
{
    int i;
    for ( i = 0; i < p->nMems; i++ )
        Mem_FixedStop( p->pMems[i], fVerbose );
    if ( p->pLargeChunks ) 
    {
        for ( i = 0; i < p->nLargeChunks; i++ )
            ABC_FREE( p->pLargeChunks[i] );
        ABC_FREE( p->pLargeChunks );
    }
    ABC_FREE( p->pMems );
    ABC_FREE( p->pMap );
    ABC_FREE( p );
}